

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O1

DualMap * __thiscall bloaty::DualMaps::AppendMap(DualMaps *this)

{
  _Rb_tree_header *p_Var1;
  DualMap *local_10;
  
  local_10 = (DualMap *)operator_new(0x60);
  p_Var1 = &(local_10->vm_map).mappings_._M_t._M_impl.super__Rb_tree_header;
  (local_10->vm_map).mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (local_10->vm_map).mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (local_10->vm_map).mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (local_10->vm_map).mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (local_10->vm_map).mappings_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(local_10->file_map).mappings_._M_t._M_impl.super__Rb_tree_header;
  (local_10->file_map).mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (local_10->file_map).mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (local_10->file_map).mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (local_10->file_map).mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (local_10->file_map).mappings_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::
  vector<std::unique_ptr<bloaty::DualMap,std::default_delete<bloaty::DualMap>>,std::allocator<std::unique_ptr<bloaty::DualMap,std::default_delete<bloaty::DualMap>>>>
  ::emplace_back<bloaty::DualMap*>
            ((vector<std::unique_ptr<bloaty::DualMap,std::default_delete<bloaty::DualMap>>,std::allocator<std::unique_ptr<bloaty::DualMap,std::default_delete<bloaty::DualMap>>>>
              *)this,&local_10);
  return (this->maps_).
         super__Vector_base<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>._M_t.
         super__Tuple_impl<0UL,_bloaty::DualMap_*,_std::default_delete<bloaty::DualMap>_>.
         super__Head_base<0UL,_bloaty::DualMap_*,_false>._M_head_impl;
}

Assistant:

DualMap* AppendMap() {
    maps_.emplace_back(new DualMap);
    return maps_.back().get();
  }